

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

char * ndiCommandVA(ndicapi *api,char *format,__va_list_tag *ap)

{
  char cVar1;
  bool bVar2;
  uchar uVar3;
  undefined1 uVar4;
  int j;
  int iVar5;
  int iVar6;
  float (*pafVar7) [3];
  ulong uVar8;
  char (*pacVar10) [8];
  int iVar11;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  byte bVar15;
  uint uVar16;
  char *pcVar17;
  char (*pacVar18) [32];
  long lVar19;
  char (*pacVar20) [12];
  char (*pacVar21) [8];
  char (*pacVar22) [24];
  char cVar23;
  char (*pacVar24) [2];
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  char (*pacVar28) [3];
  byte bVar29;
  char (*pacVar30) [52];
  char (*pacVar31) [52];
  char (*pacVar32) [2];
  float *pfVar33;
  float *pfVar34;
  float *pfVar35;
  long lVar36;
  size_t __n;
  char *pcVar37;
  char (*pacVar38) [20];
  bool bVar39;
  bool bVar40;
  float fVar41;
  int errorCode;
  char (*local_70) [52];
  char *local_68;
  float (*local_60) [3];
  char (*local_58) [24];
  undefined4 local_4c;
  float (*local_48) [8];
  char (*local_40) [8];
  int errorCode_1;
  unsigned_long uVar9;
  
  errorCode = 0;
  pcVar14 = api->Command;
  pcVar37 = api->Reply;
  pcVar17 = api->ReplyNoCRC;
  api->ErrorCode = 0;
  *pcVar14 = '\0';
  *pcVar37 = '\0';
  *pcVar17 = '\0';
  iVar11 = api->SerialDevice;
  if (((iVar11 == -1) && (api->Hostname == (char *)0x0)) && (api->Port < 0)) {
    iVar11 = 0x101;
    goto LAB_001069e2;
  }
  if (format == (char *)0x0) {
    if ((api->IsThreadedMode == true) && (api->IsTracking == true)) {
      ndiMutexLock(api->ThreadMutex);
      iVar11 = api->SerialDevice;
    }
    api->IsTracking = false;
    if (iVar11 == -1) {
      iVar11 = ndiSocketRead(api->Socket,pcVar37,0x7ff,false,&errorCode_1);
    }
    else {
      ndiSerialComm(iVar11,0x2580,"8N1",0);
      ndiSerialFlush(api->SerialDevice,3);
      ndiSerialBreak(api->SerialDevice);
      iVar11 = ndiSerialRead(api->SerialDevice,pcVar37,0x7ff,false,&errorCode);
    }
    iVar5 = strncmp(pcVar37,"RESETBE6F\r",8);
    if (iVar5 == 0) {
      lVar12 = (long)iVar11;
      pcVar37[lVar12] = '\0';
      strncpy(pcVar17,pcVar37,lVar12 - 5);
      pcVar17[lVar12 + -5] = '\0';
      return pcVar17;
    }
    iVar11 = 0x106;
    goto LAB_001069e2;
  }
  local_68 = pcVar17;
  vsprintf(pcVar14,format,ap);
  bVar39 = true;
  uVar26 = 0;
  bVar40 = false;
  uVar27 = 0;
  uVar8 = 0;
  while( true ) {
    bVar15 = pcVar14[uVar26];
    if (bVar15 == 0) break;
    bVar29 = bVar15 ^ (byte)(uVar8 & 0xffff);
    uVar16 = (uint)((uVar8 & 0xffff) >> 8);
    if (oddparity[bVar29 & 0xf] != oddparity[bVar29 >> 4]) {
      uVar16 = uVar16 ^ 0xffffc001;
    }
    if (((bVar39) && (bVar40 = (bool)(bVar15 == 0x3a | bVar40), 0x19 < (byte)(bVar15 + 0xbf))) &&
       (9 < (byte)(bVar15 - 0x30))) {
      uVar27 = uVar26 & 0xffffffff;
      bVar39 = false;
    }
    uVar8 = (ulong)((uint)bVar29 << 7 ^ (uint)bVar29 << 6 ^ uVar16);
    uVar26 = uVar26 + 1;
  }
  iVar11 = (int)uVar27;
  if (bVar39) {
    iVar11 = (int)uVar26;
  }
  if (bVar40) {
    sprintf(pcVar14 + uVar26,"%04X");
    uVar26 = (ulong)((int)uVar26 + 4);
  }
  iVar6 = (int)uVar26;
  (pcVar14 + iVar6)[0] = '\r';
  (pcVar14 + iVar6)[1] = '\0';
  __n = (size_t)iVar11;
  iVar5 = strncmp(pcVar14,"BX",__n);
  local_58 = (char (*) [24])CONCAT71(local_58._1_7_,1);
  if ((iVar11 != 2 || iVar5 != 0) &&
     (iVar5 = strncmp(pcVar14,"GETLOG",__n), iVar11 != 6 || iVar5 != 0)) {
    iVar5 = strncmp(pcVar14,"VGET",__n);
    local_58 = (char (*) [24])CONCAT71(local_58._1_7_,iVar11 == 4 && iVar5 == 0);
  }
  local_70 = (char (*) [52])CONCAT71(local_70._1_7_,api->IsThreadedMode);
  local_60 = (float (*) [3])__n;
  if (api->IsThreadedMode == true) {
    if ((((api->IsTracking != true) || (iVar11 != 2)) ||
        ((cVar23 = *pcVar14, cVar23 != 'B' && ((cVar23 != 'T' && (cVar23 != 'G')))))) ||
       (pcVar14[1] != 'X')) {
      if (api->IsTracking != false) {
        ndiMutexLock(api->ThreadMutex);
      }
      goto LAB_00106710;
    }
    iVar5 = strcmp(pcVar14,api->ThreadCommand);
    if (iVar5 != 0) {
      ndiMutexLock(api->ThreadMutex);
      strcpy(api->ThreadCommand,pcVar14);
      api->IsThreadedCommandBinary = *pcVar14 == 'B';
      ndiMutexUnlock(api->ThreadMutex);
      iVar5 = ndiEventWait(api->ThreadBufferEvent,5000);
      if (iVar5 == 0) goto LAB_0010666c;
LAB_00106682:
      iVar5 = 0x103;
      goto LAB_00106832;
    }
LAB_0010666c:
    iVar5 = ndiEventWait(api->ThreadBufferEvent,5000);
    if (iVar5 != 0) goto LAB_00106682;
    ndiMutexLock(api->ThreadBufferMutex);
    for (uVar27 = 0; api->ThreadBuffer[uVar27] != '\0'; uVar27 = uVar27 + 1) {
      pcVar37[uVar27] = api->ThreadBuffer[uVar27];
    }
    if ((byte)local_58 == '\0') {
      pcVar37[uVar27] = '\0';
    }
    errorCode = api->ThreadErrorCode;
    local_70 = (char (*) [52])CONCAT44(local_70._4_4_,errorCode);
    ndiMutexUnlock(api->ThreadBufferMutex);
    iVar5 = (int)local_70;
    pcVar17 = local_68;
  }
  else {
LAB_00106710:
    if (iVar11 == 4) {
      pcVar17 = "INIT";
LAB_0010675e:
      iVar5 = strncmp(pcVar14,pcVar17,__n);
      if (iVar5 == 0) {
        api->IsTracking = false;
      }
    }
    else if (iVar11 == 6) {
      iVar5 = strncmp(pcVar14,"TSTART",__n);
      if (iVar5 == 0) {
        api->IsTracking = true;
        if ((byte)local_70 != '\0') {
          *api->ThreadCommand = '\0';
        }
      }
    }
    else if (iVar11 == 5) {
      pcVar17 = "TSTOP";
      goto LAB_0010675e;
    }
    if (api->SerialDevice == -1) {
      ndiSocketFlush(api->Socket,1);
    }
    else {
      ndiSerialFlush(api->SerialDevice,1);
    }
    if (api->SerialDevice == -1) {
      iVar5 = ndiSocketWrite(api->Socket,pcVar14,iVar6 + 1);
    }
    else {
      iVar5 = ndiSerialWrite(api->SerialDevice,pcVar14,iVar6 + 1);
    }
    if (iVar5 < 0) {
      errorCode = 0x104;
LAB_00106809:
      uVar27 = 0;
    }
    else {
      if (iVar5 <= iVar6) {
        errorCode = 0x103;
        goto LAB_00106809;
      }
      uVar27 = 0;
      if (errorCode == 0) {
        if (api->SerialDevice == -1) {
          uVar16 = ndiSocketRead(api->Socket,pcVar37,0x7ff,(bool)(byte)local_58,&errorCode);
        }
        else {
          uVar16 = ndiSerialRead(api->SerialDevice,pcVar37,0x7ff,(bool)(byte)local_58,&errorCode);
        }
        uVar27 = (ulong)uVar16;
        if ((int)uVar16 < 0) {
          errorCode = 0x105;
          uVar27 = 0;
        }
        else if (uVar16 == 0) {
          errorCode = 0x103;
          uVar27 = 0;
        }
        if ((byte)local_58 == '\0') {
          pcVar37[uVar27] = '\0';
        }
      }
    }
    iVar5 = errorCode;
    pcVar17 = local_68;
    if ((api->IsTracking & (byte)local_70) != 0) {
      ndiMutexUnlock(api->ThreadMutex);
      iVar5 = errorCode;
      pcVar17 = local_68;
    }
  }
  local_68 = pcVar17;
  if (iVar5 != 0) {
LAB_00106832:
    anon_unknown.dwarf_ae3::ndiSetError(api,iVar5);
    return local_68;
  }
  uVar25 = (int)uVar27 - 5;
  uVar16 = (int)uVar27 - 2;
  if ((byte)local_58 == '\0') {
    uVar16 = uVar25;
  }
  if ((int)uVar16 < 0) {
    iVar5 = 0x100;
    goto LAB_00106832;
  }
  uVar27 = (ulong)uVar16;
  uVar26 = 0;
  uVar8 = 0;
  while( true ) {
    uVar13 = uVar8 & 0xffff;
    if (uVar27 == uVar26) break;
    bVar15 = (byte)uVar13 ^ pcVar37[uVar26];
    uVar16 = (uint)uVar13 >> 8;
    if (oddparity[bVar15 & 0xf] != oddparity[bVar15 >> 4]) {
      uVar16 = uVar16 ^ 0xffffc001;
    }
    uVar8 = (ulong)((uint)bVar15 << 7 ^ (uint)bVar15 << 6 ^ uVar16);
    pcVar17[uVar26] = pcVar37[uVar26];
    uVar26 = uVar26 + 1;
  }
  if ((byte)local_58 == '\0') {
    pcVar17[uVar27] = '\0';
    uVar9 = ndiHexToUnsignedLong(pcVar37 + uVar25,4);
    if (uVar9 == uVar13) goto LAB_00106a2b;
  }
  else if (*(short *)(pcVar37 + uVar27) == (short)uVar8) {
LAB_00106a2b:
    cVar23 = *pcVar17;
    iVar5 = (int)cVar23;
    if ((iVar5 == 0x45) && (iVar6 = strncmp(pcVar17,"ERROR",5), iVar6 == 0)) {
      uVar9 = ndiHexToUnsignedLong(pcVar17 + 5,2);
      iVar11 = (int)uVar9;
      goto LAB_001069e2;
    }
    cVar1 = *pcVar14;
    if (cVar1 == 'B') {
      if ((pcVar14[1] == 'X') && (iVar11 == 2)) {
        uVar27 = 1;
        if (pcVar14[2] == ' ') {
          cVar1 = pcVar14[3];
        }
        else {
          if (pcVar14[2] != ':') goto LAB_00106b68;
          cVar1 = pcVar14[7];
        }
        if (cVar1 != '\r') {
          uVar27 = ndiHexToUnsignedLong(pcVar14 + 3,4);
        }
LAB_00106b68:
        if (cVar23 != -0x3c) {
          return pcVar17;
        }
        if (pcVar17[1] != -0x5b) {
          return pcVar17;
        }
        api->BxReplyLength = *(unsigned_short *)(pcVar17 + 2);
        pacVar22 = (char (*) [24])(ulong)(byte)pcVar17[6];
        api->BxHandleCount = pcVar17[6];
        local_48 = api->BxTransforms;
        local_70 = (char (*) [52])api->BxToolMarkerInformation;
        local_60 = api->BxActiveSingleStrayMarkerPosition;
        pacVar28 = api->Bx3DMarkerOutOfVolume;
        pcVar14 = api->BxToolMarkerInformation[0] + 1;
        pfVar34 = api->Bx3DMarkerPosition[0][0] + 2;
        pfVar35 = (float *)(pcVar17 + 7);
        local_58 = pacVar22;
        for (uVar26 = 0; (char (*) [24])uVar26 != pacVar22; uVar26 = uVar26 + 1) {
          api->BxHandles[uVar26] = *(char *)pfVar35;
          cVar23 = *(char *)((long)pfVar35 + 1);
          api->BxHandlesStatus[uVar26] = cVar23;
          pfVar33 = (float *)((long)pfVar35 + 2);
          if (cVar23 != '\x04') {
            if ((uVar27 & 1) != 0) {
              if (cVar23 != '\x02') {
                local_48[uVar26][0] = *(float *)((long)pfVar35 + 2);
                local_48[uVar26][1] = *(float *)((long)pfVar35 + 6);
                local_48[uVar26][2] = *(float *)((long)pfVar35 + 10);
                local_48[uVar26][3] = *(float *)((long)pfVar35 + 0xe);
                local_48[uVar26][4] = *(float *)((long)pfVar35 + 0x12);
                local_48[uVar26][5] = *(float *)((long)pfVar35 + 0x16);
                local_48[uVar26][6] = *(float *)((long)pfVar35 + 0x1a);
                local_48[uVar26][7] = *(float *)((long)pfVar35 + 0x1e);
                pfVar33 = (float *)((long)pfVar35 + 0x22);
              }
              api->BxPortStatus[uVar26] =
                   (uint)*(byte *)((long)pfVar33 + 3) << 0x18 |
                   (int)*(char *)((long)pfVar33 + 2) << 0x10 |
                   (int)*(char *)((long)pfVar33 + 1) << 8 | (int)*(char *)pfVar33;
              api->BxFrameNumber[uVar26] = (uint)pfVar33[1];
              pfVar33 = pfVar33 + 2;
            }
            if ((uVar27 & 2) != 0) {
              (*(char (*) [11])((long)local_70 + uVar26 * 0xb))[0] = *(char *)pfVar33;
              for (lVar12 = 0; lVar12 != 10; lVar12 = lVar12 + 1) {
                pcVar14[lVar12] = *(char *)((long)pfVar33 + lVar12 + 1);
              }
              pfVar33 = (float *)((long)pfVar33 + 0xb);
            }
            if ((uVar27 & 4) != 0) {
              cVar23 = *(char *)pfVar33;
              api->BxActiveSingleStrayMarkerStatus[uVar26] = cVar23;
              if (cVar23 == '\0') {
                pfVar33 = (float *)((long)pfVar33 + 1);
              }
              else {
                local_60[uVar26][0] = *(float *)((long)pfVar33 + 1);
                local_60[uVar26][1] = *(float *)((long)pfVar33 + 5);
                local_60[uVar26][2] = *(float *)((long)pfVar33 + 9);
                pfVar33 = (float *)((long)pfVar33 + 0xd);
              }
            }
            if ((uVar27 & 8) != 0) {
              cVar23 = *(char *)pfVar33;
              api->Bx3DMarkerCount[uVar26] = cVar23;
              fVar41 = ceilf((float)(int)cVar23 * 0.125);
              uVar8 = (ulong)(uint)(int)fVar41;
              if ((int)fVar41 < 1) {
                uVar8 = 0;
              }
              for (uVar13 = 0; uVar8 != uVar13; uVar13 = uVar13 + 1) {
                (*pacVar28)[uVar13] = *(char *)((long)pfVar33 + uVar13 + 1);
              }
              pfVar33 = (float *)((long)pfVar33 + uVar13 + 1);
              pfVar35 = pfVar34;
              for (lVar12 = 0; pacVar22 = local_58, lVar12 < api->Bx3DMarkerCount[uVar26];
                  lVar12 = lVar12 + 1) {
                (*(float (*) [3])(pfVar35 + -2))[0] = *pfVar33;
                pfVar35[-1] = pfVar33[1];
                *pfVar35 = pfVar33[2];
                pfVar33 = pfVar33 + 3;
                pfVar35 = pfVar35 + 3;
              }
            }
          }
          pcVar14 = pcVar14 + 0xb;
          pacVar28 = pacVar28 + 1;
          pfVar34 = pfVar34 + 0x3c;
          pfVar35 = pfVar33;
        }
        if (((uint)uVar27 >> 0xc & 1) != 0) {
          cVar23 = *(char *)pfVar35;
          uVar16 = (uint)cVar23;
          api->BxPassiveStrayCount = uVar16;
          fVar41 = ceilf((float)(int)uVar16 * 0.125);
          pcVar14 = api->BxPassiveStrayOutOfVolume;
          uVar27 = 0;
          if (0 < (int)fVar41) {
            uVar27 = (ulong)(uint)(int)fVar41;
          }
          while( true ) {
            pfVar34 = (float *)((long)pfVar35 + 1);
            bVar39 = uVar27 == 0;
            uVar27 = uVar27 - 1;
            if (bVar39) break;
            *pcVar14 = *(char *)pfVar34;
            pcVar14 = pcVar14 + 1;
            pfVar35 = pfVar34;
          }
          uVar26 = 0;
          uVar27 = (ulong)uVar16;
          if (cVar23 < '\x01') {
            uVar27 = uVar26;
          }
          for (; uVar27 * 0xc - uVar26 != 0; uVar26 = uVar26 + 0xc) {
            *(undefined4 *)((long)api->BxPassiveStrayPosition[0] + uVar26) =
                 *(undefined4 *)((long)pfVar34 + uVar26);
            *(undefined4 *)((long)api->BxPassiveStrayPosition[0] + uVar26 + 4) =
                 *(undefined4 *)((long)pfVar35 + uVar26 + 5);
            *(undefined4 *)((long)api->BxPassiveStrayPosition[0] + uVar26 + 8) =
                 *(undefined4 *)((long)pfVar35 + uVar26 + 9);
          }
          pfVar35 = (float *)((long)pfVar34 + uVar26);
        }
        api->BxSystemStatus = (int)*(char *)pfVar35 | (int)*(char *)((long)pfVar35 + 1) << 8;
        return local_68;
      }
      goto LAB_00106dfb;
    }
    if (cVar1 == 'G') {
      if ((pcVar14[1] != 'X') || (iVar11 != 2)) {
        bVar39 = iVar11 == 4;
LAB_00106fa6:
        local_70 = (char (*) [52])CONCAT44(local_70._4_4_,iVar5);
        local_58 = (char (*) [24])CONCAT71(local_58._1_7_,iVar11 == 5);
        bVar2 = false;
        bVar40 = false;
        goto LAB_00106fb7;
      }
      uVar9 = 1;
      if (pcVar14[2] == ' ') {
        cVar23 = pcVar14[3];
joined_r0x001076eb:
        if ((cVar23 != '\r') && (uVar9 = ndiHexToUnsignedLong(pcVar14 + 3,4), (uVar9 & 1) == 0)) {
          bVar15 = 0;
          pcVar14 = pcVar17;
          goto LAB_001078d1;
        }
      }
      else if (pcVar14[2] == ':') {
        cVar23 = pcVar14[7];
        goto joined_r0x001076eb;
      }
      pcVar14 = pcVar17;
      for (uVar16 = 0; uVar16 < 3; uVar16 = uVar16 + 3) {
        pacVar30 = api->GxTransforms;
        for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
          for (lVar19 = 0; ((int)lVar19 != 0x33 && ('\x1f' < pcVar14[lVar19])); lVar19 = lVar19 + 1)
          {
            (*pacVar30)[lVar19] = pcVar14[lVar19];
          }
          (*pacVar30)[lVar19] = '\0';
          pcVar14 = pcVar14 + lVar19 + (ulong)(pcVar14[lVar19] == '\n');
          pacVar30 = pacVar30 + 1;
        }
        for (lVar12 = 0; ((int)lVar12 != 8 && ('\x1f' < pcVar14[lVar12])); lVar12 = lVar12 + 1) {
          api->GxStatus[lVar12] = pcVar14[lVar12];
        }
        pcVar14 = pcVar14 + lVar12;
      }
      bVar15 = 1;
      pcVar14 = pcVar14 + (*pcVar14 == '\n');
LAB_001078d1:
      if ((uVar9 & 2) != 0) {
        pacVar20 = api->GxInformation;
        for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
          for (lVar19 = 0; ((int)lVar19 != 0xc && ('\x1f' < pcVar14[lVar19])); lVar19 = lVar19 + 1)
          {
            (*pacVar20)[lVar19] = pcVar14[lVar19];
          }
          pacVar20 = pacVar20 + 1;
          pcVar14 = pcVar14 + lVar19;
        }
        pcVar14 = pcVar14 + (*pcVar14 == '\n');
      }
      if ((uVar9 & 4) != 0) {
        pacVar22 = api->GxSingleStray;
        for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
          for (lVar19 = 0; ((int)lVar19 != 0x15 && ('\x1f' < pcVar14[lVar19])); lVar19 = lVar19 + 1)
          {
            (*pacVar22)[lVar19] = pcVar14[lVar19];
          }
          (*pacVar22)[lVar19] = '\0';
          pcVar14 = pcVar14 + lVar19 + (ulong)(pcVar14[lVar19] == '\n');
          pacVar22 = pacVar22 + 1;
        }
      }
      if ((uVar9 & 8) != 0) {
        pacVar21 = api->GxFrame;
        for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
          for (lVar19 = 0; ((int)lVar19 != 8 && ('\x1f' < pcVar14[lVar19])); lVar19 = lVar19 + 1) {
            (*pacVar21)[lVar19] = pcVar14[lVar19];
          }
          pacVar21 = pacVar21 + 1;
          pcVar14 = pcVar14 + lVar19;
        }
        pcVar14 = pcVar14 + (*pcVar14 == '\n');
      }
      if (-1 < (short)uVar9) {
        return pcVar17;
      }
      uVar27 = 9;
      if (((uint)uVar9 >> 0xd & 1) == 0) {
        uVar27 = 3;
      }
      uVar16 = (uint)uVar27;
      if (!(bool)(~bVar15 & uVar9 != 0x8000)) {
        pacVar30 = api->GxPassiveTransforms;
        pcVar37 = api->GxPassiveStatus;
        uVar26 = 0;
        while (uVar16 = (uint)uVar27, (long)uVar26 < (long)(int)uVar16) {
          pacVar31 = pacVar30;
          for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
            for (lVar19 = 0; ((int)lVar19 != 0x33 && ('\x1f' < pcVar14[lVar19]));
                lVar19 = lVar19 + 1) {
              (*pacVar31)[lVar19] = pcVar14[lVar19];
            }
            (*pacVar31)[lVar19] = '\0';
            pcVar14 = pcVar14 + lVar19 + (ulong)(pcVar14[lVar19] == '\n');
            pacVar31 = pacVar31 + 1;
          }
          for (lVar12 = 0; (cVar23 = pcVar14[lVar12], (int)lVar12 != 8 && ('\x1f' < cVar23));
              lVar12 = lVar12 + 1) {
            pcVar37[lVar12] = cVar23;
          }
          uVar26 = uVar26 + 3;
          if (cVar23 != '\n') {
            uVar27 = uVar26 & 0xffffffff;
          }
          pcVar14 = pcVar14 + (ulong)(cVar23 == '\n') + lVar12;
          pacVar30 = pacVar30 + 3;
          pcVar37 = pcVar37 + 8;
        }
        pcVar14 = pcVar14 + (*pcVar14 == '\n');
      }
      if ((uVar9 & 2) != 0) {
        pacVar20 = api->GxPassiveInformation;
        uVar27 = 0;
        uVar26 = 0;
        if (0 < (int)uVar16) {
          uVar26 = (ulong)uVar16;
        }
        for (; uVar27 != uVar26; uVar27 = uVar27 + 1) {
          for (lVar12 = 0; ((int)lVar12 != 0xc && ('\x1f' < pcVar14[lVar12])); lVar12 = lVar12 + 1)
          {
            (*pacVar20)[lVar12] = pcVar14[lVar12];
          }
          pacVar20 = pacVar20 + 1;
          pcVar14 = pcVar14 + lVar12;
        }
        pcVar14 = pcVar14 + (*pcVar14 == '\n');
      }
      if ((uVar9 & 8) != 0) {
        pacVar21 = api->GxPassiveFrame;
        uVar26 = 0;
        uVar27 = (ulong)uVar16;
        if ((int)uVar16 < 1) {
          uVar27 = uVar26;
        }
        for (; uVar26 != uVar27; uVar26 = uVar26 + 1) {
          for (lVar12 = 0; ((int)lVar12 != 8 && ('\x1f' < pcVar14[lVar12])); lVar12 = lVar12 + 1) {
            (*pacVar21)[lVar12] = pcVar14[lVar12];
          }
          pacVar21 = pacVar21 + 1;
          pcVar14 = pcVar14 + lVar12;
        }
        pcVar14 = pcVar14 + (*pcVar14 == '\n');
      }
      if (((uint)uVar9 >> 0xc & 1) == 0) {
        return pcVar17;
      }
      lVar12 = 0;
      while( true ) {
        if ((int)lVar12 == 0x1a7) {
          return pcVar17;
        }
        if (pcVar14[lVar12] < ' ') break;
        api->GxPassiveStray[lVar12] = pcVar14[lVar12];
        lVar12 = lVar12 + 1;
      }
      return pcVar17;
    }
    if (cVar1 == 'T') {
      if ((pcVar14[1] == 'X') && (iVar11 == 2)) {
        local_48 = (float (*) [8])0x1;
        if (pcVar14[2] == ' ') {
          cVar23 = pcVar14[3];
        }
        else {
          if (pcVar14[2] != ':') goto LAB_00106ab2;
          cVar23 = pcVar14[7];
        }
        if (cVar23 != '\r') {
          local_48 = (float (*) [8])ndiHexToUnsignedLong(pcVar14 + 3,4);
        }
LAB_00106ab2:
        pafVar7 = (float (*) [3])ndiHexToUnsignedLong(pcVar17,2);
        pcVar14 = pcVar17 + 2;
        for (lVar12 = 0; (int)lVar12 != 2; lVar12 = lVar12 + 1) {
          if (pcVar17[lVar12] < ' ') {
            pcVar14 = pcVar17 + lVar12;
            break;
          }
        }
        local_70 = api->TxTransforms;
        pacVar21 = api->TxStatus;
        local_40 = api->TxFrame;
        pacVar20 = api->TxInformation;
        local_58 = api->TxSingleStray;
        uVar16 = 0;
        while (iVar11 = (int)pafVar7, (int)uVar16 < iVar11) {
          pcVar37 = pcVar14 + 2;
          for (lVar12 = 0; (int)lVar12 != 2; lVar12 = lVar12 + 1) {
            if (pcVar14[lVar12] < ' ') {
              local_60 = pafVar7;
              uVar9 = ndiHexToUnsignedLong(pcVar14,2);
              uVar3 = (uchar)uVar9;
              pcVar37 = pcVar14 + lVar12;
              goto LAB_00107320;
            }
          }
          if (*pcVar37 == 'U') {
            pcVar37 = pcVar14 + 0xc;
            for (lVar12 = 2; (int)lVar12 != 0xc; lVar12 = lVar12 + 1) {
              if (pcVar14[lVar12] < ' ') {
                pcVar37 = pcVar14 + lVar12;
                break;
              }
            }
            pafVar7 = (float (*) [3])(ulong)(iVar11 - 1);
            pcVar14 = pcVar37;
            pcVar17 = local_68;
          }
          else {
            local_60 = pafVar7;
            uVar9 = ndiHexToUnsignedLong(pcVar14,2);
            uVar3 = (uchar)uVar9;
LAB_00107320:
            api->TxHandles[uVar16] = uVar3;
            if (((ulong)local_48 & 1) != 0) {
              if (*pcVar37 == 'M') {
                for (lVar12 = 0; ((int)lVar12 != 7 && ('\x1f' < pcVar37[lVar12]));
                    lVar12 = lVar12 + 1) {
                  (*local_70)[lVar12] = pcVar37[lVar12];
                }
              }
              else if (*pcVar37 == 'D') {
                for (lVar12 = 0; ((int)lVar12 != 8 && ('\x1f' < pcVar37[lVar12]));
                    lVar12 = lVar12 + 1) {
                  (*local_70)[lVar12] = pcVar37[lVar12];
                }
              }
              else {
                for (lVar12 = 0; ((int)lVar12 != 0x33 && ('\x1f' < pcVar37[lVar12]));
                    lVar12 = lVar12 + 1) {
                  (*local_70)[lVar12] = pcVar37[lVar12];
                }
              }
              (*local_70)[lVar12] = '\0';
              for (lVar19 = 0; ((int)lVar19 != 8 && ('\x1f' < pcVar37[lVar19 + lVar12]));
                  lVar19 = lVar19 + 1) {
                (*pacVar21)[lVar19] = pcVar37[lVar19 + lVar12];
              }
              pacVar10 = local_40 + uVar16;
              iVar11 = 8;
              for (pcVar37 = pcVar37 + lVar19 + lVar12;
                  (bVar39 = iVar11 != 0, iVar11 = iVar11 + -1, bVar39 && ('\x1f' < *pcVar37));
                  pcVar37 = pcVar37 + 1) {
                (*pacVar10)[0] = *pcVar37;
                pacVar10 = (char (*) [8])(*pacVar10 + 1);
              }
            }
            if (((ulong)local_48 & 2) != 0) {
              for (lVar12 = 0; ((int)lVar12 != 0x14 && ('\x1f' < pcVar37[lVar12]));
                  lVar12 = lVar12 + 1) {
                (*pacVar20)[lVar12] = pcVar37[lVar12];
              }
              pcVar37 = pcVar37 + lVar12;
            }
            if (((ulong)local_48 & 4) != 0) {
              lVar12 = 0;
              if (*pcVar37 == 'M') {
                for (; ((int)lVar12 != 7 && ('\x1f' < pcVar37[lVar12])); lVar12 = lVar12 + 1) {
                  (*local_58)[lVar12] = pcVar37[lVar12];
                }
              }
              else if (*pcVar37 == 'D') {
                for (; ((int)lVar12 != 8 && ('\x1f' < pcVar37[lVar12])); lVar12 = lVar12 + 1) {
                  (*local_58)[lVar12] = pcVar37[lVar12];
                }
              }
              else {
                for (; ((int)lVar12 != 0x15 && ('\x1f' < pcVar37[lVar12])); lVar12 = lVar12 + 1) {
                  (*local_58)[lVar12] = pcVar37[lVar12];
                }
              }
              pcVar37 = pcVar37 + lVar12;
              (*local_58)[lVar12] = '\0';
            }
            pcVar37 = pcVar37 + -1;
            do {
              pcVar14 = pcVar37 + 1;
              pcVar37 = pcVar37 + 1;
            } while ('\x1f' < *pcVar14);
            pcVar14 = pcVar37 + (*pcVar14 == '\n');
            uVar16 = uVar16 + 1;
            local_70 = local_70 + 1;
            pacVar21 = pacVar21 + 1;
            pacVar20 = pacVar20 + 1;
            local_58 = local_58 + 1;
            pafVar7 = local_60;
            pcVar17 = local_68;
          }
        }
        api->TxHandleCount = iVar11;
        if (((uint)local_48 >> 0xc & 1) != 0) {
          uVar9 = ndiHexToUnsignedLong(pcVar14,2);
          pcVar37 = pcVar14 + 2;
          for (lVar12 = 0; (int)lVar12 != 2; lVar12 = lVar12 + 1) {
            if (pcVar14[lVar12] < ' ') {
              pcVar37 = pcVar14 + lVar12;
              break;
            }
          }
          iVar11 = 0x32;
          if ((int)uVar9 < 0x32) {
            iVar11 = (int)uVar9;
          }
          api->TxPassiveStrayCount = iVar11;
          pcVar14 = api->TxPassiveStrayOov;
          uVar27 = (long)(iVar11 + 3) / 4;
          uVar26 = 0;
          if (0 < (int)uVar27) {
            uVar26 = uVar27 & 0xffffffff;
          }
          for (; (iVar5 = (int)uVar26, uVar26 = (ulong)(iVar5 - 1), iVar5 != 0 &&
                 ('\x1f' < *pcVar37)); pcVar37 = pcVar37 + 1) {
            *pcVar14 = *pcVar37;
            pcVar14 = pcVar14 + 1;
          }
          uVar26 = 0;
          uVar27 = (ulong)(uint)(iVar11 * 0x15);
          if (iVar11 * 0x15 < 1) {
            uVar27 = uVar26;
          }
          for (; ((int)uVar27 != (int)uVar26 && ('\x1f' < pcVar37[uVar26])); uVar26 = uVar26 + 1) {
            api->TxPassiveStray[uVar26] = pcVar37[uVar26];
          }
          api->TxPassiveStray[uVar26] = '\0';
          pcVar14 = pcVar37 + uVar26;
        }
        lVar12 = 0;
        while( true ) {
          if ((int)lVar12 == 4) {
            return pcVar17;
          }
          if (pcVar14[lVar12] < ' ') break;
          api->TxSystemStatus[lVar12] = pcVar14[lVar12];
          lVar12 = lVar12 + 1;
        }
        return pcVar17;
      }
    }
    else if ((cVar1 == 'C') && (iVar11 == 4)) {
      iVar6 = strncmp(pcVar14,"COMM",(size_t)local_60);
      bVar39 = true;
      if (iVar6 != 0) goto LAB_00106fa6;
      local_4c = 0x314e38;
      bVar15 = pcVar14[5];
      if ((bVar15 & 0xf8) == 0x30) {
        iVar11 = *(int *)("VER:065EE\r" + (ulong)bVar15 * 4 + 3);
      }
      else {
        iVar11 = 0x2580;
        if (bVar15 == 0x41) {
          iVar11 = 0x38400;
        }
      }
      if (pcVar14[6] == '1') {
        local_4c = 0x314e37;
      }
      if (pcVar14[7] == '1') {
        uVar4 = 0x4f;
LAB_00107bef:
        local_4c._0_2_ = CONCAT11(uVar4,(char)local_4c);
      }
      else if (pcVar14[7] == '2') {
        uVar4 = 0x45;
        goto LAB_00107bef;
      }
      if (pcVar14[8] == '1') {
        local_4c = (uint)CONCAT12(0x32,(undefined2)local_4c);
      }
      cVar23 = pcVar14[9];
      ndiSerialSleep(api->SerialDevice,100);
      iVar11 = ndiSerialComm(api->SerialDevice,iVar11,(char *)&local_4c,(uint)(cVar23 == '1'));
      if (iVar11 == 0) {
        return pcVar17;
      }
      iVar11 = 0x102;
      goto LAB_001069e2;
    }
LAB_00106dfb:
    bVar39 = iVar11 == 4;
    bVar40 = cVar1 == 'I';
    if ((bVar40) && (bVar39)) {
      iVar6 = strncmp(pcVar14,"INIT",(size_t)local_60);
      bVar40 = true;
      bVar39 = true;
      if (iVar6 == 0) {
        if (api->SerialDevice != -1) {
          ndiSerialSleep(api->SerialDevice,100);
          return pcVar17;
        }
        ndiSocketSleep(api->Socket,100);
        return pcVar17;
      }
    }
    local_58 = (char (*) [24])CONCAT71(local_58._1_7_,iVar11 == 5);
    if (((!bVar40) || (iVar11 != 5)) ||
       (iVar6 = strncmp(pcVar14,"IRCHK",(size_t)local_60), iVar6 != 0)) {
      local_70 = (char (*) [52])CONCAT44(local_70._4_4_,iVar5);
      bVar2 = false;
      bVar40 = cVar1 == 'P';
      if ((bVar40) && (iVar11 == 5)) {
        iVar11 = strncmp(pcVar14,"PHINF",(size_t)local_60);
        pcVar37 = local_68;
        pacVar30 = local_70;
        bVar2 = true;
        if (iVar11 == 0) {
          uVar27 = 1;
          if (pcVar14[5] == ' ') {
            cVar23 = pcVar14[6];
joined_r0x00107cf9:
            if (cVar23 != '\r') {
              uVar27 = ndiHexToUnsignedLong(pcVar14 + 8,4);
            }
          }
          else if (pcVar14[5] == ':') {
            cVar23 = pcVar14[10];
            goto joined_r0x00107cf9;
          }
          cVar23 = (char)pacVar30;
          api->PhinfUnoccupied = (uint)(cVar23 == 'U') * 3;
          pcVar14 = pcVar37;
          if ((uVar27 & 1) != 0) {
            pcVar17 = api->PhinfBasic;
            if (cVar23 == 'U') {
              for (iVar11 = 0; iVar11 != 8; iVar11 = iVar11 + 1) {
                *pcVar17 = '0';
                pcVar17 = pcVar17 + 1;
              }
              for (lVar12 = 0; (int)lVar12 != 0xc; lVar12 = lVar12 + 1) {
                pcVar17[lVar12] = ' ';
              }
              for (lVar19 = 0; (int)lVar19 != 0xd; lVar19 = lVar19 + 1) {
                pcVar17[lVar12 + lVar19] = '0';
              }
            }
            else {
              for (lVar12 = 0; ((int)lVar12 != 0x21 && ('\x1f' < pcVar37[lVar12]));
                  lVar12 = lVar12 + 1) {
                pcVar17[lVar12] = pcVar37[lVar12];
              }
              pcVar14 = pcVar37 + lVar12;
            }
          }
          if ((uVar27 & 2) != 0) {
            lVar12 = 0;
            if (cVar23 == 'U') {
              for (; (int)lVar12 != 8; lVar12 = lVar12 + 1) {
                api->PhinfTesting[lVar12] = '0';
              }
            }
            else {
              for (; ((int)lVar12 != 8 && ('\x1f' < pcVar14[lVar12])); lVar12 = lVar12 + 1) {
                api->PhinfTesting[lVar12] = pcVar14[lVar12];
              }
              pcVar14 = pcVar14 + lVar12;
            }
          }
          if ((uVar27 & 4) != 0) {
            lVar12 = 0;
            if (cVar23 == 'U') {
              for (; (int)lVar12 != 0x14; lVar12 = lVar12 + 1) {
                api->PhinfPartNumber[lVar12] = ' ';
              }
            }
            else {
              for (; ((int)lVar12 != 0x14 && ('\x1f' < pcVar14[lVar12])); lVar12 = lVar12 + 1) {
                api->PhinfPartNumber[lVar12] = pcVar14[lVar12];
              }
              pcVar14 = pcVar14 + lVar12;
            }
          }
          if ((uVar27 & 8) == 0) {
LAB_00107e06:
            if ((uVar27 & 0x10) == 0) goto LAB_00107e42;
            if (cVar23 != 'U') {
              for (lVar12 = 0; ((int)lVar12 != 2 && ('\x1f' < pcVar14[lVar12])); lVar12 = lVar12 + 1
                  ) {
                api->PhinfMarkerType[lVar12] = pcVar14[lVar12];
              }
              pcVar14 = pcVar14 + lVar12;
              goto LAB_00107e42;
            }
          }
          else {
            if (cVar23 != 'U') {
              for (lVar12 = 0; ((int)lVar12 != 2 && ('\x1f' < pcVar14[lVar12])); lVar12 = lVar12 + 1
                  ) {
                api->PhinfAccessories[lVar12] = pcVar14[lVar12];
              }
              pcVar14 = pcVar14 + lVar12;
              goto LAB_00107e06;
            }
            api->PhinfAccessories[0] = '0';
            api->PhinfAccessories[1] = '0';
            if ((uVar27 & 0x10) == 0) goto LAB_00107e42;
          }
          api->PhinfMarkerType[0] = '0';
          api->PhinfMarkerType[1] = '0';
LAB_00107e42:
          if ((uVar27 & 0x20) != 0) {
            lVar12 = 0;
            if (cVar23 == 'U') {
              for (; (int)lVar12 != 0xe; lVar12 = lVar12 + 1) {
                api->PhinfPortLocation[lVar12] = '0';
              }
            }
            else {
              for (; ((int)lVar12 != 0xe && ('\x1f' < pcVar14[lVar12])); lVar12 = lVar12 + 1) {
                api->PhinfPortLocation[lVar12] = pcVar14[lVar12];
              }
              pcVar14 = pcVar14 + lVar12;
            }
          }
          if ((uVar27 & 0x40) == 0) {
            return pcVar37;
          }
          if ((byte)local_70 == 'U') {
            api->PhinfGpioStatus[0] = '0';
            api->PhinfGpioStatus[1] = '0';
            return pcVar37;
          }
          lVar12 = 0;
          while( true ) {
            if ((int)lVar12 == 2) {
              return pcVar37;
            }
            if (pcVar14[lVar12] < ' ') break;
            api->PhinfGpioStatus[lVar12] = pcVar14[lVar12];
            lVar12 = lVar12 + 1;
          }
          return pcVar37;
        }
      }
LAB_00106fb7:
      pafVar7 = local_60;
      pcVar37 = local_68;
      if ((bVar40) && (bVar39)) {
        iVar11 = strncmp(pcVar14,"PHRQ",(size_t)local_60);
        if (iVar11 == 0) {
          api->PhrqReply[0] = (char)local_70;
          api->PhrqReply[1] = pcVar37[1];
          return pcVar37;
        }
        iVar11 = strncmp(pcVar14,"PHSR",(size_t)pafVar7);
        if (iVar11 == 0) {
          for (lVar12 = 0; ((int)lVar12 != 0x502 && ('\x1f' < pcVar37[lVar12])); lVar12 = lVar12 + 1
              ) {
            api->PhsrReply[lVar12] = pcVar37[lVar12];
          }
          api->PhsrReply[lVar12] = '\0';
          return pcVar37;
        }
      }
      if (!bVar2) {
        if ((cVar1 == 'S' & (byte)local_58) != 1) {
          return pcVar37;
        }
        iVar11 = strncmp(pcVar14,"SSTAT",(size_t)local_60);
        if (iVar11 != 0) {
          return pcVar37;
        }
        uVar9 = ndiHexToUnsignedLong(pcVar14 + 6,4);
        pcVar14 = pcVar37;
        if ((uVar9 & 1) != 0) {
          api->SstatControl[0] = (char)local_70;
          pcVar14 = pcVar37 + 2;
          api->SstatControl[1] = pcVar37[1];
        }
        if ((uVar9 & 2) != 0) {
          api->SstatSensor[0] = *pcVar14;
          pcVar17 = pcVar14 + 1;
          pcVar14 = pcVar14 + 2;
          api->SstatSensor[1] = *pcVar17;
        }
        if ((uVar9 & 4) == 0) {
          return pcVar37;
        }
        api->SstatTiu[0] = *pcVar14;
        api->SstatTiu[1] = pcVar14[1];
        return pcVar37;
      }
      iVar11 = strncmp(pcVar14,"PSTAT",(size_t)local_60);
      if (iVar11 != 0) {
        return pcVar37;
      }
      uVar27 = 1;
      if (pcVar14[5] == ' ') {
        cVar23 = pcVar14[6];
      }
      else {
        if (pcVar14[5] != ':') goto LAB_00107055;
        cVar23 = pcVar14[10];
      }
      if (cVar23 != '\r') {
        uVar27 = ndiHexToUnsignedLong(pcVar14 + 6,4);
      }
LAB_00107055:
      pacVar18 = api->PstatBasic;
      pcVar14 = pcVar37;
      pacVar24 = api->PstatAccessories;
      pacVar32 = api->PstatMarkerType;
      pacVar38 = api->PstatPartNumber;
      pacVar21 = api->PstatTesting;
      for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
        if ((uVar27 & 1) != 0) {
          for (lVar19 = 0; (int)lVar19 != 0x20; lVar19 = lVar19 + 1) {
            if (pcVar14[lVar19] < ' ') {
              (*pacVar18)[lVar19] = '\0';
              break;
            }
            (*pacVar18)[lVar19] = pcVar14[lVar19];
          }
          pcVar14 = pcVar14 + lVar19;
        }
        if ((uVar27 & 2) != 0) {
          api->PstatTesting[lVar12][0] = '\0';
          for (lVar19 = 0; ((int)lVar19 != 8 && ('\x1f' < pcVar14[lVar19])); lVar19 = lVar19 + 1) {
            (*pacVar21)[lVar19] = pcVar14[lVar19];
          }
          pcVar14 = pcVar14 + lVar19;
        }
        if ((uVar27 & 4) != 0) {
          api->PstatPartNumber[lVar12][0] = '\0';
          for (lVar19 = 0; ((int)lVar19 != 0x14 && ('\x1f' < pcVar14[lVar19])); lVar19 = lVar19 + 1)
          {
            (*pacVar38)[lVar19] = pcVar14[lVar19];
          }
          pcVar14 = pcVar14 + lVar19;
        }
        if ((uVar27 & 8) != 0) {
          api->PstatAccessories[lVar12][0] = '\0';
          for (lVar19 = 0; ((int)lVar19 != 2 && ('\x1f' < pcVar14[lVar19])); lVar19 = lVar19 + 1) {
            (*pacVar24)[lVar19] = pcVar14[lVar19];
          }
          pcVar14 = pcVar14 + lVar19;
        }
        if ((uVar27 & 0x10) != 0) {
          api->PstatMarkerType[lVar12][0] = '\0';
          for (lVar19 = 0; ((int)lVar19 != 2 && ('\x1f' < pcVar14[lVar19])); lVar19 = lVar19 + 1) {
            (*pacVar32)[lVar19] = pcVar14[lVar19];
          }
          pcVar14 = pcVar14 + lVar19;
        }
        pcVar14 = pcVar14 + -1;
        do {
          pcVar17 = pcVar14 + 1;
          pcVar14 = pcVar14 + 1;
        } while ('\x1f' < *pcVar17);
        pcVar14 = pcVar14 + (*pcVar17 == '\n');
        pacVar18 = pacVar18 + 1;
        pacVar21 = pacVar21 + 1;
        pacVar38 = pacVar38 + 1;
        pacVar24 = pacVar24 + 1;
        pacVar32 = pacVar32 + 1;
      }
      if (-1 < (short)uVar27) {
        return pcVar37;
      }
      lVar12 = 9;
      if (((uint)uVar27 >> 0xd & 1) == 0) {
        lVar12 = 3;
      }
      lVar19 = 0;
      pacVar24 = api->PstatPassiveAccessories;
      pacVar32 = api->PstatPassiveMarkerType;
      pacVar18 = api->PstatPassiveBasic;
      pacVar38 = api->PstatPassivePartNumber;
      pacVar21 = api->PstatPassiveTesting;
      do {
        if (lVar19 == lVar12) {
          return pcVar37;
        }
        if ((uVar27 & 1) != 0) {
          api->PstatPassiveBasic[lVar19][0] = '\0';
          for (lVar36 = 0; (int)lVar36 != 0x20; lVar36 = lVar36 + 1) {
            if (pcVar14[lVar36] < ' ') {
              (*pacVar18)[lVar36] = '\0';
              break;
            }
            (*pacVar18)[lVar36] = pcVar14[lVar36];
          }
          pcVar14 = pcVar14 + lVar36;
        }
        if ((uVar27 & 2) != 0) {
          api->PstatPassiveTesting[lVar19][0] = '\0';
          for (lVar36 = 0; ((int)lVar36 != 8 && ('\x1f' < pcVar14[lVar36])); lVar36 = lVar36 + 1) {
            (*pacVar21)[lVar36] = pcVar14[lVar36];
          }
          pcVar14 = pcVar14 + lVar36;
        }
        if ((uVar27 & 4) != 0) {
          api->PstatPassivePartNumber[lVar19][0] = '\0';
          for (lVar36 = 0; ((int)lVar36 != 0x14 && ('\x1f' < pcVar14[lVar36])); lVar36 = lVar36 + 1)
          {
            (*pacVar38)[lVar36] = pcVar14[lVar36];
          }
          pcVar14 = pcVar14 + lVar36;
        }
        if ((uVar27 & 8) != 0) {
          api->PstatPassiveAccessories[lVar19][0] = '\0';
          for (lVar36 = 0; ((int)lVar36 != 2 && ('\x1f' < pcVar14[lVar36])); lVar36 = lVar36 + 1) {
            (*pacVar24)[lVar36] = pcVar14[lVar36];
          }
          pcVar14 = pcVar14 + lVar36;
        }
        if ((uVar27 & 0x10) != 0) {
          api->PstatPassiveMarkerType[lVar19][0] = '\0';
          for (lVar36 = 0; ((int)lVar36 != 2 && ('\x1f' < pcVar14[lVar36])); lVar36 = lVar36 + 1) {
            (*pacVar32)[lVar36] = pcVar14[lVar36];
          }
          pcVar14 = pcVar14 + lVar36;
        }
        pcVar14 = pcVar14 + -1;
        do {
          pcVar37 = pcVar14 + 1;
          pcVar14 = pcVar14 + 1;
        } while ('\x1f' < *pcVar37);
        pcVar14 = pcVar14 + (*pcVar37 == '\n');
        lVar19 = lVar19 + 1;
        pacVar18 = pacVar18 + 1;
        pacVar21 = pacVar21 + 1;
        pacVar38 = pacVar38 + 1;
        pacVar24 = pacVar24 + 1;
        pacVar32 = pacVar32 + 1;
        pcVar37 = local_68;
      } while( true );
    }
    uVar9 = 0;
    if (pcVar14[5] == ' ') {
      cVar23 = pcVar14[6];
joined_r0x00107b85:
      if ((cVar23 != '\r') &&
         (uVar9 = ndiHexToUnsignedLong(pcVar14 + 6,4), pcVar14 = pcVar17, (uVar9 & 1) == 0))
      goto LAB_00107bac;
    }
    else if (pcVar14[5] == ':') {
      cVar23 = pcVar14[10];
      goto joined_r0x00107b85;
    }
    api->IrchkDetected = iVar5;
    pcVar14 = pcVar17 + 1;
LAB_00107bac:
    if ((uVar9 & 2) == 0) {
      return pcVar17;
    }
    lVar12 = 0;
    while( true ) {
      if (lVar12 == 0x7e) {
        return pcVar17;
      }
      if (pcVar14[lVar12] < ' ') break;
      api->IrchkSources[lVar12] = pcVar14[lVar12];
      lVar12 = lVar12 + 1;
    }
    return pcVar17;
  }
  iVar11 = 0x100;
LAB_001069e2:
  anon_unknown.dwarf_ae3::ndiSetError(api,iVar11);
  return pcVar17;
}

Assistant:

ndicapiExport char* ndiCommandVA(ndicapi* api, const char* format, va_list ap)
{
  int i, bytes, commandLength;
  bool useCrc = false;
  bool inCommand = true;
  char* command;
  char* reply;
  char* commandReply;
  int errorCode = 0;

  command = api->Command;       // text sent to ndicapi
  reply = api->Reply;     // text received from ndicapi
  commandReply = api->ReplyNoCRC;   // received text, with CRC hacked off
  commandLength = 0;                  // length of 'command' part of command

  api->ErrorCode = 0;                 // clear error
  command[0] = '\0';
  reply[0] = '\0';
  commandReply[0] = '\0';

  // verify that the serial device was opened
  if (api->SerialDevice == NDI_INVALID_HANDLE && api->Hostname == NULL && api->Port < 0)
  {
    ndiSetError(api, NDI_OPEN_ERROR);
    return commandReply;
  }

  // if the command is NULL, send a break to reset the Measurement System
  if (format == NULL)
  {
    if (api->IsThreadedMode && api->IsTracking)
    {
      // block the tracking thread
      ndiMutexLock(api->ThreadMutex);
    }
    api->IsTracking = false;

    if (api->SerialDevice != NDI_INVALID_HANDLE)
    {
      ndiSerialComm(api->SerialDevice, 9600, "8N1", 0);
      ndiSerialFlush(api->SerialDevice, NDI_IOFLUSH);
      ndiSerialBreak(api->SerialDevice);
      bytes = ndiSerialRead(api->SerialDevice, reply, 2047, false, &errorCode);
    }
    else
    {
      int errorCode;
      bytes = ndiSocketRead(api->Socket, reply, 2047, false, &errorCode);
    }

    // check for correct reply
    if (strncmp(reply, "RESETBE6F\r", 8) != 0)
    {
      ndiSetError(api, NDI_RESET_FAIL);
      return commandReply;
    }

    // terminate the reply string
    reply[bytes] = '\0';
    bytes -= 5;
    strncpy(commandReply, reply, bytes);
    commandReply[bytes] = '\0';

    // return the reply string, minus the CRC
    return commandReply;
  }

  vsprintf(command, format, ap);                    // format parameters

  unsigned short CRC16 = 0;                         // calculate CRC
  for (i = 0; command[i] != '\0'; i++)
  {
    CalcCRC16(command[i], &CRC16);
    if (inCommand && command[i] == ':')             // only use CRC if a ':'
    {
      useCrc = true;                                //  follows the command
    }
    if (inCommand && !((command[i] >= 'A' && command[i] <= 'Z') ||
                       (command[i] >= '0' && command[i] <= '9')))
    {
      inCommand = false;                            // 'command' part has ended
      commandLength = i;                            // command length
    }
  }
  if (inCommand)
  {
    // Command was sent with no ':'
    // Example, ndiCommand("INIT");
    commandLength = i;
  }

  if (useCrc)
  {
    sprintf(&command[i], "%04X", CRC16);            // tack on the CRC
    i += 4;
  }

  command[i++] = '\r';                              // tack on carriage return
  command[i] = '\0';                                // terminate for good luck

  bool isBinary = (strncmp(command, "BX", commandLength) == 0 && commandLength == strlen("BX") ||
                   strncmp(command, "GETLOG", commandLength) == 0 && commandLength == strlen("GETLOG") ||
                   strncmp(command, "VGET", commandLength) == 0 && commandLength == strlen("VGET"));


  // if the command is GX, TX, or BX and thread_mode is on, we copy the reply from
  //  the thread rather than getting it directly from the Measurement System
  if (api->IsThreadedMode && api->IsTracking &&
      commandLength == 2 && (command[0] == 'G' && command[1] == 'X' ||
                             command[0] == 'T' && command[1] == 'X' ||
                             command[0] == 'B' && command[1] == 'X'))
  {
    // check that the thread is sending the GX/BX/TX command that we want
    if (strcmp(command, api->ThreadCommand) != 0)
    {
      // tell thread to start using the new GX/BX/TX command
      ndiMutexLock(api->ThreadMutex);
      strcpy(api->ThreadCommand, command);
      api->IsThreadedCommandBinary = (command[0] == 'B');
      ndiMutexUnlock(api->ThreadMutex);
      // wait for the next data record to arrive (we have to throw it away)
      if (ndiEventWait(api->ThreadBufferEvent, 5000))
      {
        ndiSetError(api, NDI_TIMEOUT);
        return commandReply;
      }
    }
    // there is usually no wait, because usually new data is ready
    if (ndiEventWait(api->ThreadBufferEvent, 5000))
    {
      ndiSetError(api, NDI_TIMEOUT);
      return commandReply;
    }
    // copy the thread's reply buffer into the main reply buffer
    ndiMutexLock(api->ThreadBufferMutex);
    for (bytes = 0; api->ThreadBuffer[bytes] != '\0'; bytes++)
    {
      reply[bytes] = api->ThreadBuffer[bytes];
    }
    if (!isBinary)
    {
      reply[bytes] = '\0';   // terminate string
    }
    errorCode = api->ThreadErrorCode;
    ndiMutexUnlock(api->ThreadBufferMutex);

    if (errorCode != 0)
    {
      ndiSetError(api, errorCode);
      return commandReply;
    }
  }
  // if the command is not a GX or thread_mode is not on, then
  //   send the command directly to the Measurement System and get a reply
  else
  {
    bool isThreadMode = api->IsThreadedMode;

    if (isThreadMode && api->IsTracking)
    {
      // block the tracking thread while we slip this command through
      ndiMutexLock(api->ThreadMutex);
    }

    // change pol->tracking if either TSTOP or TSTART is sent
    if ((commandLength == 5 && strncmp(command, "TSTOP", commandLength) == 0) ||
        (commandLength == 4 && strncmp(command, "INIT", commandLength) == 0))
    {
      api->IsTracking = false;
    }
    else if (commandLength == 6 && strncmp(command, "TSTART", commandLength) == 0)
    {
      api->IsTracking = true;
      if (isThreadMode)
      {
        // this will force the thread to wait until the application sends the first GX command
        api->ThreadCommand[0] = '\0';
      }
    }

    if (api->SerialDevice != NDI_INVALID_HANDLE)
    {
      // flush the input buffer, because anything that we haven't read
      //   yet is garbage left over by a previously failed command
      ndiSerialFlush(api->SerialDevice, NDI_IFLUSH);
    }
    else
    {
      ndiSocketFlush(api->Socket, NDI_IFLUSH);
    }

    // send the command to the Measurement System
    if (api->SerialDevice != NDI_INVALID_HANDLE)
    {
      bytes = ndiSerialWrite(api->SerialDevice, command, i);
    }
    else
    {
      bytes = ndiSocketWrite(api->Socket, command, i);
    }
    if (bytes < 0)
    {
      errorCode = NDI_WRITE_ERROR;
    }
    else if (bytes < i)
    {
      errorCode = NDI_TIMEOUT;
    }

    // read the reply from the Measurement System
    bytes = 0;
    if (errorCode == 0)
    {
      if (api->SerialDevice != NDI_INVALID_HANDLE)
      {
        bytes = ndiSerialRead(api->SerialDevice, reply, 2047, isBinary, &errorCode);
      }
      else
      {
        bytes = ndiSocketRead(api->Socket, reply, 2047, isBinary, &errorCode);
      }
      if (bytes < 0)
      {
        errorCode = NDI_READ_ERROR;
        bytes = 0;
      }
      else if (bytes == 0)
      {
        errorCode = NDI_TIMEOUT;
      }
      if (!isBinary)
      {
        reply[bytes] = '\0';   // terminate string
      }
    }

    if (isThreadMode & api->IsTracking)
    {
      // unblock the tracking thread
      ndiMutexUnlock(api->ThreadMutex);
    }

    if (errorCode != 0)
    {
      ndiSetError(api, errorCode);
      return commandReply;
    }
  }

  // back up to before the CRC
  if (!isBinary)
  {
    bytes -= 5; // 4 ASCII chars
  }
  else
  {
    bytes -= 2; // 2 bytes (unsigned short)
  }
  if (bytes < 0)
  {
    ndiSetError(api, NDI_BAD_CRC);
    return commandReply;
  }

  // calculate the CRC and copy serial_reply to command_reply
  CRC16 = 0;
  for (i = 0; i < bytes; i++)
  {
    CalcCRC16(reply[i], &CRC16);
    commandReply[i] = reply[i];
  }

  if (!isBinary)
  {
    // terminate command_reply before the CRC
    commandReply[i] = '\0';
  }

  if (errorCode != 0)
  {
    // Any above errors are caught here and returned after the command has had its CRC stripped
    return commandReply;
  }

  if (!isBinary)
  {
    // read and check the CRC value of the reply
    if (CRC16 != ndiHexToUnsignedLong(&reply[bytes], 4))
    {
      ndiSetError(api, NDI_BAD_CRC);
      return commandReply;
    }
  }
  else
  {
    unsigned short replyCrc = (unsigned char)reply[bytes + 1] << 8 | (unsigned char)reply[bytes];
    if (replyCrc != CRC16)
    {
      ndiSetError(api, NDI_BAD_CRC);
      return commandReply;
    }
  }

  // check for error code
  if (commandReply[0] == 'E' && strncmp(commandReply, "ERROR", 5) == 0)
  {
    ndiSetError(api, ndiHexToUnsignedLong(&commandReply[5], 2));
    return commandReply;
  }

  // special behavior for specific commands
  if (command[0] == 'T' && command[1] == 'X' && commandLength == 2)   // the TX command
  {
    ndiTXHelper(api, command, commandReply);
  }
  else if (command[0] == 'B' && command[1] == 'X' && commandLength == 2)   // the BX command
  {
    ndiBXHelper(api, command, commandReply);
  }
  else if (command[0] == 'G' && command[1] == 'X' && commandLength == 2)   // the GX command
  {
    ndiGXHelper(api, command, commandReply);
  }
  else if (command[0] == 'C' && commandLength == 4 && strncmp(command, "COMM", commandLength) == 0)
  {
    ndiCOMMHelper(api, command, commandReply);
  }
  else if (command[0] == 'I' && commandLength == 4 && strncmp(command, "INIT", commandLength) == 0)
  {
    ndiINITHelper(api, command, commandReply);
  }
  else if (command[0] == 'I' && commandLength == 5 && strncmp(command, "IRCHK", commandLength) == 0)
  {
    ndiIRCHKHelper(api, command, commandReply);
  }
  else if (command[0] == 'P' && commandLength == 5 && strncmp(command, "PHINF", commandLength) == 0)
  {
    ndiPHINFHelper(api, command, commandReply);
  }
  else if (command[0] == 'P' && commandLength == 4 && strncmp(command, "PHRQ", commandLength) == 0)
  {
    ndiPHRQHelper(api, command, commandReply);
  }
  else if (command[0] == 'P' && commandLength == 4 && strncmp(command, "PHSR", commandLength) == 0)
  {
    ndiPHSRHelper(api, command, commandReply);
  }
  else if (command[0] == 'P' && commandLength == 5 && strncmp(command, "PSTAT", commandLength) == 0)
  {
    ndiPSTATHelper(api, command, commandReply);
  }
  else if (command[0] == 'S' && commandLength == 5 && strncmp(command, "SSTAT", commandLength) == 0)
  {
    ndiSSTATHelper(api, command, commandReply);
  }

  // return the Measurement System reply, but with the CRC hacked off
  return commandReply;
}